

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O1

ssize_t __thiscall Atari::ST::Video::write(Video *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ssize_t extraout_RAX;
  undefined7 extraout_var;
  ulong uVar4;
  uint uVar5;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  uVar4 = (ulong)__buf & 0xffffffff;
  uVar5 = __fd & 0x3f;
  uVar2 = uVar5 - 0x21;
  if (0xe < uVar2) {
    if (uVar5 < 5) {
      if (uVar5 == 0) {
        *(short *)((long)&this->base_address_ + 2) = (short)((ulong)__buf & 0xff);
        return (ulong)__buf & 0xff;
      }
      if (uVar5 != 1) {
        return (ulong)uVar2;
      }
      uVar2 = this->base_address_ & 0xff00ff;
      this->base_address_ = ((uint)__buf & 0xff) << 8 | uVar2;
      return (ulong)uVar2;
    }
    if (uVar5 == 5) {
      local_38._8_8_ = (ulong)__buf & 0xffff;
      pcStack_20 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/ST/Video.cpp:493:35)>
                   ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/ST/Video.cpp:493:35)>
                 ::_M_manager;
      local_38._M_unused._M_object = this;
      DeferredQueue<HalfCycles>::defer
                (&this->deferrer_,(HalfCycles)0x2,(function<void_()> *)&local_38);
      if (local_28 == (code *)0x0) {
        return 0;
      }
      bVar1 = (*local_28)(&local_38,&local_38,__destroy_functor);
      return CONCAT71(extraout_var,bVar1);
    }
    if (uVar5 != 0x20) {
      if (uVar5 != 0x30) {
        return (ulong)uVar2;
      }
      this->video_mode_ = (uint16_t)uVar4;
      update_output_mode(this);
      return extraout_RAX;
    }
    if (((this->video_stream_).duration_ != 0) && ((this->video_stream_).output_mode_ == Pixels)) {
      VideoStream::flush_border(&this->video_stream_);
    }
  }
  uVar3 = (ulong)uVar5;
  this->raw_palette_[uVar3 - 0x20] = (uint16_t)uVar4;
  *(byte *)(this->raw_palette_ + (uVar3 - 0x10)) = (byte)(uVar4 >> 7) & 0xe;
  *(byte *)((long)this->raw_palette_ + uVar3 * 2 + -0x1f) = (char)uVar4 * '\x02' & 0xee;
  return uVar3;
}

Assistant:

void Video::write(int address, uint16_t value) {
	address &= 0x3f;
	switch(address) {
		default: break;

		// Start address.
		case 0x00:	base_address_ = (base_address_ & 0x00ffff) | ((value & 0xff) << 16);	break;
		case 0x01:	base_address_ = (base_address_ & 0xff00ff) | ((value & 0xff) << 8);		break;

		// Sync mode and pixel mode.
		case 0x05:
			// Writes to sync mode have a one-cycle delay in effect.
			deferrer_.defer(HalfCycles(2), [this, value] {
				sync_mode_ = value;
				update_output_mode();
			});
		break;
		case 0x30:
			video_mode_ = value;
			update_output_mode();
		break;

		// Palette.
		case 0x20:	case 0x21:	case 0x22:	case 0x23:
		case 0x24:	case 0x25:	case 0x26:	case 0x27:
		case 0x28:	case 0x29:	case 0x2a:	case 0x2b:
		case 0x2c:	case 0x2d:	case 0x2e:	case 0x2f: {
			if(address == 0x20) video_stream_.will_change_border_colour();

			raw_palette_[address - 0x20] = value;
			uint8_t *const entry = reinterpret_cast<uint8_t *>(&palette_[address - 0x20]);
			entry[0] = uint8_t((value & 0x700) >> 7);
			entry[1] = uint8_t((value & 0x77) << 1);
		} break;
	}
}